

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.h
# Opt level: O2

void __thiscall cppcms::http::context::reset_specific<sender::src_prop>(context *this,src_prop *ptr)

{
  long lVar1;
  undefined8 *puVar2;
  
  if (ptr != (src_prop *)0x0) {
    lVar1 = cppcms::http::context::get_holder();
    if ((lVar1 != 0) &&
       (lVar1 = __dynamic_cast(lVar1,&holder::typeinfo,&specific_holder<sender::src_prop>::typeinfo,
                               0), lVar1 != 0)) {
      booster::hold_ptr<sender::src_prop>::reset((hold_ptr<sender::src_prop> *)(lVar1 + 8),ptr);
      return;
    }
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = &PTR__specific_holder_00114c18;
    puVar2[1] = ptr;
  }
  cppcms::http::context::set_holder((holder *)this);
  return;
}

Assistant:

void reset_specific(T *ptr = 0)
			{
				if(ptr == 0) {
					set_holder(0);
					return;
				}
				specific_holder<T> *sh=dynamic_cast<specific_holder<T> *>(get_holder());
				if(sh) {
					sh->p.reset(ptr);
				}
				else {
					specific_holder<T> *sh = new specific_holder<T>(ptr);
					set_holder(sh);
				}
			}